

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

ObjectData * __thiscall
deqp::gles3::Performance::anon_unknown_0::GradientCostCase::genOccludedGeometry
          (ObjectData *__return_storage_ptr__,GradientCostCase *this)

{
  _Vector_base<float,_std::allocator<float>_> _Stack_138;
  string local_120;
  string local_100;
  ProgramSources local_e0;
  
  Performance::(anonymous_namespace)::Utils::getInstanceNoiseVertexShader_abi_cxx11_();
  Performance::(anonymous_namespace)::Utils::getDepthAsRedFragmentShader_abi_cxx11_();
  glu::makeVtxFragSources(&local_e0,&local_100,&local_120);
  Utils::getFullscreenQuadWithGradient
            ((vector<float,_std::allocator<float>_> *)&_Stack_138,this->m_gradientDistance,1.0);
  ObjectData::ObjectData(__return_storage_ptr__,&local_e0,(Geometry *)&_Stack_138);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&_Stack_138);
  glu::ProgramSources::~ProgramSources(&local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  return __return_storage_ptr__;
}

Assistant:

virtual ObjectData	genOccludedGeometry	(void) const
	{
		return ObjectData(glu::makeVtxFragSources(Utils::getInstanceNoiseVertexShader(), Utils::getDepthAsRedFragmentShader()), Utils::getFullscreenQuadWithGradient(m_gradientDistance, 1.0f));
	}